

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void forbody(LexState *ls,int base,int line,int nvars,int isgen)

{
  FuncState *fs;
  Dyndata *pDVar1;
  int pc;
  int iVar2;
  bool bVar3;
  BlockCnt bl;
  BlockCnt local_48;
  
  fs = ls->fs;
  checknext(ls,0x102);
  bVar3 = false;
  pc = luaK_codeABx(fs,forbody::forprep[(uint)isgen],base,0);
  fs->freereg = fs->freereg + 0xff;
  local_48.isloop = '\0';
  local_48.nactvar = fs->nactvar;
  pDVar1 = fs->ls->dyd;
  local_48.firstlabel = (pDVar1->label).n;
  local_48.firstgoto = (pDVar1->gt).n;
  local_48.upval = '\0';
  local_48.previous = fs->bl;
  if (local_48.previous != (BlockCnt *)0x0) {
    bVar3 = (local_48.previous)->insidetbc != '\0';
  }
  fs->bl = &local_48;
  local_48.insidetbc = bVar3;
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  iVar2 = luaK_getlabel(fs);
  fixforjump(fs,pc,iVar2,0);
  if (isgen != 0) {
    luaK_codeABCk(fs,OP_TFORCALL,base,0,nvars,0);
    luaK_fixline(fs,line);
  }
  iVar2 = luaK_codeABx(fs,forbody::forloop[(uint)isgen],base,0);
  fixforjump(fs,iVar2,pc + 1,1);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isgen) {
  /* forbody -> DO block */
  static const OpCode forprep[2] = {OP_FORPREP, OP_TFORPREP};
  static const OpCode forloop[2] = {OP_FORLOOP, OP_TFORLOOP};
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  checknext(ls, TK_DO);
  prep = luaK_codeABx(fs, forprep[isgen], base, 0);
  fs->freereg--;  /* both 'forprep' remove one register from the stack */
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  fixforjump(fs, prep, luaK_getlabel(fs), 0);
  if (isgen) {  /* generic for? */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
  }
  endfor = luaK_codeABx(fs, forloop[isgen], base, 0);
  fixforjump(fs, endfor, prep + 1, 1);
  luaK_fixline(fs, line);
}